

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

string * __thiscall
stackjit::Runtime::Internal::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,Internal *this,RegisterValue value,Type *type)

{
  char cVar1;
  __type _Var2;
  ostream *poVar3;
  string *psVar4;
  PrimitiveTypes primitiveType;
  int floatPattern;
  string sStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stringstream;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stringstream);
  cVar1 = (**(code **)(*(long *)value + 0x10))(value);
  if (cVar1 == '\0') {
    psVar4 = Type::name_abi_cxx11_((Type *)value);
    TypeSystem::toString_abi_cxx11_(&sStack_1f8,(TypeSystem *)0x2,primitiveType);
    _Var2 = std::operator==(psVar4,&sStack_1f8);
    std::__cxx11::string::~string((string *)&sStack_1f8);
    if (_Var2) {
      std::ostream::operator<<(local_1a8,SUB84(this,0));
    }
    else {
      std::ostream::_M_insert<long>((long)local_1a8);
    }
  }
  else if (this == (Internal *)0x0) {
    std::operator<<(local_1a8,"nullref");
  }
  else {
    poVar3 = std::operator<<(local_1a8,"0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  psVar4 = Type::name_abi_cxx11_((Type *)value);
  std::operator+(&local_1d8," (",psVar4);
  std::operator+(&sStack_1f8,&local_1d8,")");
  std::operator<<(local_1a8,(string *)&sStack_1f8);
  std::__cxx11::string::~string((string *)&sStack_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stringstream);
  return __return_storage_ptr__;
}

Assistant:

std::string Runtime::Internal::valueToString(RegisterValue value, const Type* type) {
		std::stringstream stringstream;
		if (type->isReference()) {
			if (value == 0) {
				stringstream<< "nullref";
			} else {
				stringstream << "0x" << std::hex << value << std::dec;
			}
		} else if (type->name() == TypeSystem::toString(PrimitiveTypes::Float)) {
			int floatPattern = (int)value;
			float floatValue = *(reinterpret_cast<float*>(&floatPattern));
			stringstream << floatValue;
		} else {
			stringstream << value;
		}

		stringstream << " (" + type->name() + ")";
		return stringstream.str();
	}